

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

bool __thiscall cfd::core::Script::IsP2wpkhScript(Script *this)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  size_type sVar4;
  const_reference pvVar5;
  ScriptOperator *this_00;
  bool local_45;
  ByteData local_30;
  Script *local_18;
  Script *this_local;
  
  local_18 = this;
  sVar3 = ByteData::GetDataSize(&this->script_data_);
  bVar1 = false;
  local_45 = false;
  if (sVar3 == 0x16) {
    sVar4 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::size
                      (&this->script_stack_);
    local_45 = false;
    if (sVar4 == 2) {
      pvVar5 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
               operator[](&this->script_stack_,0);
      this_00 = ScriptElement::GetOpCode(pvVar5);
      bVar2 = ScriptOperator::operator==(this_00,(ScriptOperator *)ScriptOperator::OP_0);
      local_45 = false;
      if (bVar2) {
        pvVar5 = ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ::operator[](&this->script_stack_,1);
        bVar2 = ScriptElement::IsBinary(pvVar5);
        local_45 = false;
        if (bVar2) {
          pvVar5 = ::std::
                   vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                   operator[](&this->script_stack_,1);
          ScriptElement::GetBinaryData(&local_30,pvVar5);
          bVar1 = true;
          sVar3 = ByteData::GetDataSize(&local_30);
          local_45 = sVar3 == 0x14;
        }
      }
    }
  }
  this_local._7_1_ = local_45;
  if (bVar1) {
    ByteData::~ByteData((ByteData *)0x3ffc0c);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Script::IsP2wpkhScript() const {
  return (
      script_data_.GetDataSize() == kScriptHashP2wpkhLength &&
      script_stack_.size() == 2 &&
      script_stack_[0].GetOpCode() == ScriptOperator::OP_0 &&
      script_stack_[1].IsBinary() &&
      script_stack_[1].GetBinaryData().GetDataSize() == kByteData160Length);
}